

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O0

void boost::to_string_helper<unsigned_long,std::allocator<unsigned_long>,std::__cxx11::string>
               (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,bool dump_all)

{
  bool bVar1;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this;
  size_type sVar2;
  ulong uVar3;
  char_type *__c1;
  byte in_DL;
  ulong in_RSI;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  size_type i;
  size_type len;
  Ch one;
  Ch zero;
  ctype<char> *fac;
  undefined8 in_stack_ffffffffffffffa0;
  char __c;
  locale *this_00;
  ulong local_48;
  char_type local_36;
  char_type local_35;
  locale local_28 [8];
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_20;
  byte local_11;
  ulong local_10;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_8;
  
  __c = (char)((ulong)in_stack_ffffffffffffffa0 >> 0x38);
  local_11 = in_DL & 1;
  this_00 = local_28;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::locale::locale(this_00);
  this = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
         std::use_facet<std::ctype<char>>(this_00);
  std::locale::~locale(local_28);
  local_20 = this;
  local_35 = std::ctype<char>::widen((ctype<char> *)this_00,__c);
  local_36 = std::ctype<char>::widen((ctype<char> *)this_00,__c);
  if ((local_11 & 1) == 0) {
    uVar3 = dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::size(local_8);
  }
  else {
    sVar2 = dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::num_blocks
                      ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x1cd811);
    uVar3 = sVar2 << 6;
  }
  std::__cxx11::string::assign(local_10,(char)uVar3);
  for (local_48 = 0; local_48 < uVar3; local_48 = local_48 + 1) {
    bVar1 = dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_unchecked_test
                      (this,(size_type)this_00);
    if (bVar1) {
      __c1 = (char_type *)std::__cxx11::string::operator[](local_10);
      std::char_traits<char>::assign(__c1,&local_36);
    }
  }
  return;
}

Assistant:

void to_string_helper(const dynamic_bitset<B, A> & b, stringT & s,
                      bool dump_all)
{
    typedef typename stringT::traits_type Tr;
    typedef typename stringT::value_type  Ch;

    BOOST_DYNAMIC_BITSET_CTYPE_FACET(Ch, fac, std::locale());
    const Ch zero = BOOST_DYNAMIC_BITSET_WIDEN_CHAR(fac, '0');
    const Ch one  = BOOST_DYNAMIC_BITSET_WIDEN_CHAR(fac, '1');

    // Note that this function may access (when
    // dump_all == true) bits beyond position size() - 1

    typedef typename dynamic_bitset<B, A>::size_type size_type;

    const size_type len = dump_all?
         dynamic_bitset<B, A>::bits_per_block * b.num_blocks():
         b.size();
    s.assign (len, zero);

    for (size_type i = 0; i < len; ++i) {
        if (b.m_unchecked_test(i))
            Tr::assign(s[len - 1 - i], one);

    }

}